

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O2

int Fxu_PairCompare(Fxu_Pair *pPair1,Fxu_Pair *pPair2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fxu_Lit *pFVar6;
  Fxu_Lit *pFVar7;
  Fxu_Lit *pFVar8;
  Fxu_Lit *pFVar9;
  int iVar10;
  
  if (pPair1->nLits1 != pPair2->nLits1) {
    return 0;
  }
  if (pPair1->nLits2 != pPair2->nLits2) {
    return 0;
  }
  pFVar6 = (pPair1->pCube1->lLits).pHead;
  pFVar7 = (pPair1->pCube2->lLits).pHead;
  pFVar8 = (pPair2->pCube1->lLits).pHead;
  pFVar9 = (pPair2->pCube2->lLits).pHead;
  if ((byte)(pFVar9 != (Fxu_Lit *)0x0 |
            (pFVar6 != (Fxu_Lit *)0x0) * '\b' + (pFVar7 != (Fxu_Lit *)0x0) * '\x04' +
            (pFVar8 != (Fxu_Lit *)0x0) * '\x02') != 0xf) {
    __assert_fail("Code == 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPair.c"
                  ,0x102,"int Fxu_PairCompare(Fxu_Pair *, Fxu_Pair *)");
  }
  iVar5 = pFVar6->iVar;
  iVar1 = pFVar7->iVar;
  iVar4 = iVar1;
  if (iVar5 < iVar1) {
    iVar4 = iVar5;
  }
  iVar2 = pFVar8->iVar;
  iVar3 = pFVar9->iVar;
  iVar10 = iVar3;
  if (iVar2 < iVar3) {
    iVar10 = iVar2;
  }
  if (iVar4 == iVar10) {
    if (iVar5 == iVar1) {
      if (iVar2 != iVar3) {
        return 0;
      }
      pFVar6 = pFVar6->pHNext;
      pFVar7 = pFVar7->pHNext;
      goto LAB_003aac5c;
    }
    if (iVar2 == iVar3) {
      return 0;
    }
    if (iVar5 < iVar1) {
      if (iVar3 < iVar2) {
        return 0;
      }
      pFVar6 = pFVar6->pHNext;
      pFVar8 = pFVar8->pHNext;
      goto LAB_003aacb1;
    }
    if (iVar2 < iVar3) {
      return 0;
    }
    pFVar7 = pFVar7->pHNext;
  }
  else {
    if (iVar4 < iVar10) {
      if (iVar5 != iVar1) {
        return 0;
      }
      pFVar6 = pFVar6->pHNext;
      pFVar7 = pFVar7->pHNext;
      goto LAB_003aacb1;
    }
    if (iVar2 != iVar3) {
      return 0;
    }
LAB_003aac5c:
    pFVar8 = pFVar8->pHNext;
  }
  pFVar9 = pFVar9->pHNext;
LAB_003aacb1:
  iVar5 = (*(code *)(&DAT_00703a70 +
                    *(int *)(&DAT_00703a70 +
                            (ulong)((uint)(pFVar9 != (Fxu_Lit *)0x0) |
                                   (uint)(pFVar6 != (Fxu_Lit *)0x0) * 8 +
                                   (uint)(pFVar7 != (Fxu_Lit *)0x0) * 4 +
                                   (uint)(pFVar8 != (Fxu_Lit *)0x0) * 2) * 4)))();
  return iVar5;
}

Assistant:

int Fxu_PairCompare( Fxu_Pair * pPair1, Fxu_Pair * pPair2 )
{
	Fxu_Lit * pD1C1, * pD1C2;
	Fxu_Lit * pD2C1, * pD2C2;
	int TopVar1, TopVar2;
	int Code;

	if ( pPair1->nLits1 != pPair2->nLits1 )
		return 0;
	if ( pPair1->nLits2 != pPair2->nLits2 )
		return 0;

	pD1C1 = pPair1->pCube1->lLits.pHead;
	pD1C2 = pPair1->pCube2->lLits.pHead;

	pD2C1 = pPair2->pCube1->lLits.pHead;
	pD2C2 = pPair2->pCube2->lLits.pHead;

	Code  = pD1C1? 8: 0;
	Code |= pD1C2? 4: 0;
	Code |= pD2C1? 2: 0;
	Code |= pD2C2? 1: 0;
	assert( Code == 15 );

	while ( 1 )
	{
		switch ( Code )
		{
		case 0:  // -- --      NULL   NULL     NULL   NULL 
			return 1;
		case 1:  // -- -1      NULL   NULL     NULL   pD2C2
			return 0;
		case 2:  // -- 1-      NULL   NULL     pD2C1  NULL 
			return 0;
		case 3:  // -- 11      NULL   NULL     pD2C1  pD2C2
			if ( pD2C1->iVar != pD2C2->iVar )
				return 0;
			pD2C1 = pD2C1->pHNext;
			pD2C2 = pD2C2->pHNext;
			break;
		case 4:  // -1 --      NULL   pD1C2    NULL   NULL 
			return 0;
		case 5:  // -1 -1      NULL   pD1C2    NULL   pD2C2
			if ( pD1C2->iVar != pD2C2->iVar )
				return 0;
			pD1C2 = pD1C2->pHNext;
			pD2C2 = pD2C2->pHNext;
			break;
		case 6:  // -1 1-      NULL   pD1C2    pD2C1  NULL 
			return 0;
		case 7:  // -1 11      NULL   pD1C2    pD2C1  pD2C2
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar2 == pD1C2->iVar )
			{
				if ( pD2C1->iVar <= pD2C2->iVar )
					return 0;
				pD1C2 = pD1C2->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else if ( TopVar2 < pD1C2->iVar )
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else
				return 0;
			break;
		case 8:  // 1- --      pD1C1  NULL     NULL   NULL 
			return 0;
		case 9:  // 1- -1      pD1C1  NULL     NULL   pD2C2
			return 0;
		case 10: // 1- 1-      pD1C1  NULL     pD2C1  NULL 
			if ( pD1C1->iVar != pD2C1->iVar )
				return 0;
			pD1C1 = pD1C1->pHNext;
			pD2C1 = pD2C1->pHNext;
			break;
		case 11: // 1- 11      pD1C1  NULL     pD2C1  pD2C2
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar2 == pD1C1->iVar )
			{
				if ( pD2C1->iVar >= pD2C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD2C1 = pD2C1->pHNext;
			}
			else if ( TopVar2 < pD1C1->iVar )
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else
				return 0;
			break;
		case 12: // 11 --      pD1C1  pD1C2    NULL   NULL 
			if ( pD1C1->iVar != pD1C2->iVar )
				return 0;
			pD1C1 = pD1C1->pHNext;
			pD1C2 = pD1C2->pHNext;
			break;
		case 13: // 11 -1      pD1C1  pD1C2    NULL   pD2C2
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			if ( TopVar1 == pD2C2->iVar )
			{
				if ( pD1C1->iVar <= pD1C2->iVar )
					return 0;
				pD1C2 = pD1C2->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else if ( TopVar1 < pD2C2->iVar )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else
				return 0;
			break;
		case 14: // 11 1-      pD1C1  pD1C2    pD2C1  NULL 
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			if ( TopVar1 == pD2C1->iVar )
			{
				if ( pD1C1->iVar >= pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD2C1 = pD2C1->pHNext;
			}
			else if ( TopVar1 < pD2C1->iVar )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else
				return 0;
			break;
		case 15: // 11 11      pD1C1  pD1C2    pD2C1  pD2C2
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar1 == TopVar2 )
			{
				if ( pD1C1->iVar == pD1C2->iVar )
				{
					if ( pD2C1->iVar != pD2C2->iVar )
						return 0;
					pD1C1 = pD1C1->pHNext;
					pD1C2 = pD1C2->pHNext;
					pD2C1 = pD2C1->pHNext;
					pD2C2 = pD2C2->pHNext;
				}
				else
				{
					if ( pD2C1->iVar == pD2C2->iVar )
						return 0;
					if ( pD1C1->iVar < pD1C2->iVar )
					{
						if ( pD2C1->iVar > pD2C2->iVar )
							return 0;
						pD1C1 = pD1C1->pHNext;
						pD2C1 = pD2C1->pHNext;
					}
					else
					{
						if ( pD2C1->iVar < pD2C2->iVar )
							return 0;
						pD1C2 = pD1C2->pHNext;
						pD2C2 = pD2C2->pHNext;
					}
				}
			}
			else if ( TopVar1 < TopVar2 )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else 
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			break;
		default:
			assert( 0 );
			break;
		}

		Code  = pD1C1? 8: 0;
		Code |= pD1C2? 4: 0;
		Code |= pD2C1? 2: 0;
		Code |= pD2C2? 1: 0;
	}
	return 1;
}